

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.h
# Opt level: O0

size_t sdslen(sds s)

{
  uchar flags;
  sds s_local;
  
  switch(s[-1] & 7) {
  case 0:
    s_local = (sds)(long)((int)(uint)(byte)s[-1] >> 3);
    break;
  case 1:
    s_local = (sds)(ulong)(byte)s[-3];
    break;
  case 2:
    s_local = (sds)(ulong)*(ushort *)(s + -5);
    break;
  case 3:
    s_local = (sds)(ulong)*(uint *)(s + -9);
    break;
  case 4:
    s_local = *(sds *)(s + -0x11);
    break;
  default:
    s_local = (sds)0x0;
  }
  return (size_t)s_local;
}

Assistant:

static inline size_t sdslen(const sds s) {
    unsigned char flags = s[-1];
    switch(flags&SDS_TYPE_MASK) {
        case SDS_TYPE_5:
            return SDS_TYPE_5_LEN(flags);
        case SDS_TYPE_8:
            return SDS_HDR(8,s)->len;
        case SDS_TYPE_16:
            return SDS_HDR(16,s)->len;
        case SDS_TYPE_32:
            return SDS_HDR(32,s)->len;
        case SDS_TYPE_64:
            return SDS_HDR(64,s)->len;
    }
    return 0;
}